

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QSize __thiscall QMainWindowLayout::minimumSize(QMainWindowLayout *this)

{
  QSize QVar1;
  undefined8 uVar2;
  ulong uVar3;
  uint uVar4;
  Representation RVar5;
  int iVar6;
  long in_FS_OFFSET;
  QSize local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(this + 0x784) < 0) || (*(int *)(this + 0x788) < 0)) {
    local_18 = QDockAreaLayout::minimumSize((QDockAreaLayout *)(this + 0x1a0));
    QVar1 = QToolBarAreaLayout::minimumSize((QToolBarAreaLayout *)(this + 0xa0),&local_18);
    *(QSize *)(this + 0x784) = QVar1;
    if (*(long **)(this + 0x708) == (long *)0x0) {
      RVar5 = QVar1.ht.m_i;
      uVar4 = 0;
      iVar6 = 0;
    }
    else {
      uVar2 = (**(code **)(**(long **)(this + 0x708) + 0x18))();
      uVar4 = (uint)uVar2;
      iVar6 = (int)((ulong)uVar2 >> 0x20);
      QVar1.ht.m_i = 0;
      QVar1.wd.m_i = *(uint *)(this + 0x784);
      RVar5.m_i = *(int *)(this + 0x788);
    }
    uVar3 = (ulong)QVar1 & 0xffffffff;
    if (QVar1.wd.m_i.m_i < (int)uVar4) {
      uVar3 = (ulong)uVar4;
    }
    QVar1 = (QSize)(uVar3 | (ulong)(uint)(RVar5.m_i + iVar6) << 0x20);
    *(QSize *)(this + 0x784) = QVar1;
  }
  else {
    QVar1 = *(QSize *)(this + 0x784);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMainWindowLayout::minimumSize() const
{
    if (!minSize.isValid()) {
        minSize = layoutState.minimumSize();
        const QSize sbMin = statusbar ? statusbar->minimumSize() : QSize(0, 0);
        minSize = QSize(qMax(sbMin.width(), minSize.width()),
                        sbMin.height() + minSize.height());
    }
    return minSize;
}